

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode gzip_do_init(Curl_easy *data,Curl_cwriter *writer)

{
  int iVar1;
  CURLcode CVar2;
  Curl_cwriter **z_00;
  char *__s1;
  z_stream *z;
  zlib_writer *zp;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  z_00 = &writer[1].next;
  writer[3].next = (Curl_cwriter *)zalloc_cb;
  writer[3].ctx = zfree_cb;
  __s1 = (char *)zlibVersion();
  iVar1 = strcmp(__s1,"1.2.0.4");
  if (iVar1 < 0) {
    iVar1 = inflateInit2_(z_00,0xfffffff1,"1.2.11",0x70);
    if (iVar1 != 0) {
      CVar2 = process_zlib_error(data,(z_stream *)z_00);
      return CVar2;
    }
    *(undefined4 *)((long)&writer[1].cwt + 4) = 8;
    *(undefined4 *)&writer[1].cwt = 1;
  }
  else {
    iVar1 = inflateInit2_(z_00,0x2f,"1.2.11",0x70);
    if (iVar1 != 0) {
      CVar2 = process_zlib_error(data,(z_stream *)z_00);
      return CVar2;
    }
    *(undefined4 *)&writer[1].cwt = 6;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode gzip_do_init(struct Curl_easy *data,
                                 struct Curl_cwriter *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
    /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
    if(inflateInit2(z, MAX_WBITS + 32) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  }
  else {
    /* we must parse the gzip header and trailer ourselves */
    if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
      return process_zlib_error(data, z);
    }
    zp->trailerlen = 8; /* A CRC-32 and a 32-bit input size (RFC 1952, 2.2) */
    zp->zlib_init = ZLIB_INIT; /* Initial call state */
  }

  return CURLE_OK;
}